

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPDependClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPDependClause *this)

{
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
  *this_00;
  OpenMPDependClauseModifier OVar1;
  bool bVar2;
  reference ppvVar3;
  reference ppcVar4;
  uint uVar5;
  ulong __n;
  OpenMPDependClauseType OVar6;
  allocator<char> local_81;
  string clause_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  
  OVar1 = this->modifier;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"depend ",(allocator<char> *)&clause_string);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&clause_string,"(",(allocator<char> *)&local_58);
  OVar6 = this->type;
  if (OVar1 == OMPC_DEPEND_MODIFIER_iterator) {
    std::__cxx11::string::append((char *)&clause_string);
    std::__cxx11::string::append((char *)&clause_string);
    this_00 = &this->depend_iterators_definition_class;
    local_38 = (ulong)OVar6;
    for (uVar5 = 0; __n = (ulong)uVar5,
        __n < (ulong)((long)(this->depend_iterators_definition_class).
                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->
                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
      ppvVar3 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar3,0);
      std::__cxx11::string::append((char *)&clause_string);
      ppvVar3 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar3,0);
      if (**ppcVar4 != '\0') {
        std::__cxx11::string::append((char *)&clause_string);
      }
      ppvVar3 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar3,1);
      std::__cxx11::string::append((char *)&clause_string);
      std::__cxx11::string::append((char *)&clause_string);
      ppvVar3 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar3,2);
      std::__cxx11::string::append((char *)&clause_string);
      std::__cxx11::string::append((char *)&clause_string);
      ppvVar3 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar3,3);
      std::__cxx11::string::append((char *)&clause_string);
      ppvVar3 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(this_00,__n);
      ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar3,4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,*ppcVar4,&local_81);
      bVar2 = std::operator!=(&local_58,"");
      std::__cxx11::string::~string((string *)&local_58);
      if (bVar2) {
        std::__cxx11::string::append((char *)&clause_string);
        ppvVar3 = std::
                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                  ::at(this_00,__n);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar3,4);
        std::__cxx11::string::append((char *)&clause_string);
      }
      std::__cxx11::string::append((char *)&clause_string);
    }
    std::__cxx11::string::substr((ulong)&local_58,(ulong)&clause_string);
    std::__cxx11::string::operator=((string *)&clause_string,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::append((char *)&clause_string);
    OVar6 = (OpenMPDependClauseType)local_38;
  }
  if (1 < clause_string._M_string_length) {
    std::__cxx11::string::append((char *)&clause_string);
  }
  if (OVar6 < OMPC_DEPENDENCE_TYPE_unknown) {
    std::__cxx11::string::append((char *)&clause_string);
  }
  if ((OVar6 != OMPC_DEPENDENCE_TYPE_source) && (1 < clause_string._M_string_length)) {
    std::__cxx11::string::append((char *)&clause_string);
  }
  if (OVar6 == OMPC_DEPENDENCE_TYPE_sink) {
    std::__cxx11::string::string((string *)&local_58,(string *)&this->dependence_vector);
    std::__cxx11::string::append((string *)&clause_string);
    std::__cxx11::string::~string((string *)&local_58);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_58,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)&clause_string);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::append((char *)&clause_string);
  if (3 < clause_string._M_string_length) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&clause_string);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDependClause::toString() {
    OpenMPDependClauseModifier modifier = this->getModifier();
    std::vector<vector<const char*>* >* depend_iterators_definition_class;
    if (modifier == OMPC_DEPEND_MODIFIER_iterator) {
        depend_iterators_definition_class = this->getDependIteratorsDefinitionClass();
    }
    std::string result = "depend ";
    std::string clause_string = "(";

    OpenMPDependClauseType type = this->getType();
    if (modifier == OMPC_DEPEND_MODIFIER_iterator) {
        switch (modifier) {
            case OMPC_DEPEND_MODIFIER_iterator: {
                clause_string += "iterator";
                clause_string += " ( ";
                for (unsigned int i = 0; i < depend_iterators_definition_class->size(); i++) {
                    clause_string += depend_iterators_definition_class->at(i)->at(0);
                    if (strcmp(depend_iterators_definition_class->at(i)->at(0), "\0") != 0) {
                        clause_string += " ";
                    };
                    clause_string += depend_iterators_definition_class->at(i)->at(1);
                    clause_string += "=";
                    clause_string += depend_iterators_definition_class->at(i)->at(2);
                    clause_string += ":";
                    clause_string += depend_iterators_definition_class->at(i)->at(3);
                    if ((string)depend_iterators_definition_class->at(i)->at(4) != "") {
                        clause_string += ":";
                        clause_string += depend_iterators_definition_class->at(i)->at(4);
                    };
                    clause_string += ", ";
                };
                clause_string = clause_string.substr(0, clause_string.size()-2);

                clause_string += " )";
            }
            default:
            ;
        }
    }

    if (clause_string.size() > 1) {
        clause_string += ", ";
    };
    switch (type) {
        case OMPC_DEPENDENCE_TYPE_in:
            clause_string += "in";
            break;
        case OMPC_DEPENDENCE_TYPE_out:
            clause_string += "out";
            break;
        case OMPC_DEPENDENCE_TYPE_inout:
            clause_string += "inout";
            break;
        case OMPC_DEPENDENCE_TYPE_mutexinoutset:
            clause_string += "mutexinoutset";
            break;
        case OMPC_DEPENDENCE_TYPE_depobj:
            clause_string += "depobj";
            break;
        case OMPC_DEPENDENCE_TYPE_source:
            clause_string += "source";
            break;
        case OMPC_DEPENDENCE_TYPE_sink:
            clause_string += "sink";
            break;
        default:
            ;
    }

    if (clause_string.size() > 1&&type!=OMPC_DEPENDENCE_TYPE_source) {
        clause_string += " : ";

    };
    if(type==OMPC_DEPENDENCE_TYPE_sink){clause_string += this->getDependenceVector();}
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };
    return result;
}